

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_flattening.cpp
# Opt level: O1

void __thiscall
ModelFlattening_importedComponentWithNameClashes_Test::
~ModelFlattening_importedComponentWithNameClashes_Test
          (ModelFlattening_importedComponentWithNameClashes_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ModelFlattening, importedComponentWithNameClashes)
{
    const std::string e =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"main_model\">\n"
        "  <units name=\"common_units\">\n"
        "    <unit units=\"second\"/>\n"
        "  </units>\n"
        "  <component name=\"my_component\"/>\n"
        "  <component name=\"best_component_1\"/>\n"
        "  <component name=\"best_component\">\n"
        "    <variable name=\"v\" units=\"common_units\" initial_value=\"1\" interface=\"public_and_private\"/>\n"
        "  </component>\n"
        "  <encapsulation>\n"
        "    <component_ref component=\"my_component\">\n"
        "      <component_ref component=\"best_component_1\"/>\n"
        "    </component_ref>\n"
        "  </encapsulation>\n"
        "</model>\n";

    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(fileContents("modelflattening/importedcomponentswithnameclashes.xml"));
    auto importer = libcellml::Importer::create();

    EXPECT_TRUE(model->hasUnresolvedImports());
    importer->resolveImports(model, resourcePath("modelflattening/"));
    EXPECT_FALSE(model->hasUnresolvedImports());

    model = importer->flattenModel(model);

    auto printer = libcellml::Printer::create();

    auto a = printer->printModel(model);
    EXPECT_EQ(e, a);
}